

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsScissorTests.cpp
# Opt level: O0

void vkt::FragmentOperations::anon_unknown_0::applyScissor
               (PixelBufferAccess *imageAccess,Vec4 *floatScissorArea,Vec4 *clearColor)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int local_48;
  int local_44;
  int x;
  int y;
  int sy1;
  int sy0;
  int sx1;
  int sx0;
  IVec4 scissorRect;
  Vec4 *clearColor_local;
  Vec4 *floatScissorArea_local;
  PixelBufferAccess *imageAccess_local;
  
  scissorRect.m_data._8_8_ = clearColor;
  iVar1 = tcu::ConstPixelBufferAccess::getWidth(&imageAccess->super_ConstPixelBufferAccess);
  iVar2 = tcu::ConstPixelBufferAccess::getHeight(&imageAccess->super_ConstPixelBufferAccess);
  getAreaRect((anon_unknown_0 *)&sx1,floatScissorArea,iVar1,iVar2);
  iVar1 = tcu::Vector<int,_4>::x((Vector<int,_4> *)&sx1);
  iVar2 = tcu::Vector<int,_4>::x((Vector<int,_4> *)&sx1);
  iVar3 = tcu::Vector<int,_4>::z((Vector<int,_4> *)&sx1);
  iVar4 = tcu::Vector<int,_4>::y((Vector<int,_4> *)&sx1);
  iVar5 = tcu::Vector<int,_4>::y((Vector<int,_4> *)&sx1);
  iVar6 = tcu::Vector<int,_4>::w((Vector<int,_4> *)&sx1);
  local_44 = 0;
  while( true ) {
    iVar7 = tcu::ConstPixelBufferAccess::getHeight(&imageAccess->super_ConstPixelBufferAccess);
    if (iVar7 <= local_44) break;
    local_48 = 0;
    while( true ) {
      iVar7 = tcu::ConstPixelBufferAccess::getWidth(&imageAccess->super_ConstPixelBufferAccess);
      if (iVar7 <= local_48) break;
      if ((((local_48 < iVar1) || (iVar2 + iVar3 <= local_48)) || (local_44 < iVar4)) ||
         (iVar5 + iVar6 <= local_44)) {
        tcu::PixelBufferAccess::setPixel
                  (imageAccess,(Vec4 *)scissorRect.m_data._8_8_,local_48,local_44,0);
      }
      local_48 = local_48 + 1;
    }
    local_44 = local_44 + 1;
  }
  return;
}

Assistant:

void applyScissor (tcu::PixelBufferAccess imageAccess, const Vec4& floatScissorArea, const Vec4& clearColor)
{
	const IVec4	scissorRect	(getAreaRect(floatScissorArea, imageAccess.getWidth(), imageAccess.getHeight()));
	const int	sx0			= scissorRect.x();
	const int	sx1			= scissorRect.x() + scissorRect.z();
	const int	sy0			= scissorRect.y();
	const int	sy1			= scissorRect.y() + scissorRect.w();

	for (int y = 0; y < imageAccess.getHeight(); ++y)
	for (int x = 0; x < imageAccess.getWidth(); ++x)
	{
		// Fragments outside fail the scissor test.
		if (x < sx0 || x >= sx1 || y < sy0 || y >= sy1)
			imageAccess.setPixel(clearColor, x, y);
	}
}